

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
                    *this,Index target,Index source)

{
  Column_container *this_00;
  Column_container *this_01;
  uint uVar1;
  node_ptr plVar2;
  pointer p;
  iterator iVar3;
  iterator iVar4;
  pointer pEVar5;
  undefined8 *puVar6;
  pointer p_1;
  __hashtable *__h;
  __hashtable *__h_2;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                );
  }
  this_00 = &(this->reducedMatrixR_).matrix_;
  local_38.targetColumn._0_4_ = target;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_38);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    if ((this->reducedMatrixR_).
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
        .rowSwapped_ == true) {
      Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>
      ::_orderRows(&(this->reducedMatrixR_).
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                  );
    }
    local_38.targetColumn._0_4_ = source;
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&local_38);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_38.targetColumn =
           (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
            *)((long)iVar3.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                     ._M_cur + 0x10);
      _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence____:persistence_matrix::Column_types)7,false,true,true,true,false>>__Matrix_column_tag_1u>_false>___1_>
                ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
                  *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                           ._M_cur + 0x10),local_38.targetColumn,&local_39,&local_38,&local_3a,
                 &local_3b,&local_3c);
      if ((this->mirrorMatrixU_).
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
          .rowSwapped_ == true) {
        Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>
        ::_orderRows(&(this->mirrorMatrixU_).
                      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                    );
      }
      this_01 = &(this->mirrorMatrixU_).matrix_;
      local_38.targetColumn._0_4_ = source;
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_01->_M_h,(key_type *)&local_38);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        if ((this->mirrorMatrixU_).
            super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
            .rowSwapped_ == true) {
          Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>
          ::_orderRows(&(this->mirrorMatrixU_).
                        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                      );
        }
        local_38.targetColumn._0_4_ = target;
        iVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_01->_M_h,(key_type *)&local_38);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          if (*(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                              ._M_cur + 0x28) != 0) {
            if ((*(node_ptr *)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                         ._M_cur + 0x28) != (node_ptr)0x0) &&
               (*(node_ptr *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                        ._M_cur + 0x28) !=
                (node_ptr)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                       ._M_cur + 0x28))) {
              if (*(long *)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                                  ._M_cur + 0x30) == 0) goto LAB_0010ecee;
              uVar1 = *(uint *)(*(long *)((long)iVar4.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                                                ._M_cur + 0x28) + 0x10);
              if (*(uint *)(*(long *)((long)iVar3.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                                            ._M_cur + 0x30) + 0x10) < uVar1) {
                local_38.targetColumn._0_4_ = uVar1;
                pEVar5 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>>
                         ::construct<unsigned_int&>
                                   (*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false>>>>
                                      **)((long)iVar3.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                                                ._M_cur + 0x20),(uint *)&local_38);
                if ((pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_
                    == (node_ptr)0x0) {
                  plVar2 = *(node_ptr *)
                            ((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                                   ._M_cur + 0x30);
                  (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
                       plVar2;
                  (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
                       (node_ptr)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                              ._M_cur + 0x28);
                  *(pointer *)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_false>
                          ._M_cur + 0x30) = pEVar5;
                  plVar2->next_ = (node_ptr)pEVar5;
                  return;
                }
                __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                              "/usr/include/boost/intrusive/list.hpp",0x33c,
                              "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                             );
              }
            }
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = "The new row index has to be higher than the current pivot.";
            __cxa_throw(puVar6,&char_const*::typeinfo,0);
          }
LAB_0010ecee:
          __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                        "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, false>>::Matrix_column_tag, Type = 1]"
                       );
        }
      }
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}